

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall
tlx::CmdlineParser::add_string
          (CmdlineParser *this,char key,string *longkey,string *dest,string *desc)

{
  allocator local_51;
  string local_50;
  string *local_30;
  string *desc_local;
  string *dest_local;
  string *longkey_local;
  CmdlineParser *pCStack_10;
  char key_local;
  CmdlineParser *this_local;
  
  local_30 = desc;
  desc_local = dest;
  dest_local = longkey;
  longkey_local._7_1_ = key;
  pCStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  add_string(this,key,longkey,&local_50,desc_local,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void CmdlineParser::add_string(char key, const std::string& longkey,
                               std::string& dest, const std::string& desc) {
    return add_string(key, longkey, "", dest, desc);
}